

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O0

void ImGui_ImplGlfw_CursorEnterCallback(GLFWwindow *window,int entered)

{
  int iVar1;
  ImGui_ImplGlfw_Data *handle;
  ImGuiIO *pIVar2;
  int in_ESI;
  GLFWwindow *in_RDI;
  ImGuiIO *io;
  ImGui_ImplGlfw_Data *bd;
  float in_stack_00000018;
  undefined8 in_stack_ffffffffffffffe0;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
  handle = ImGui_ImplGlfw_GetBackendData();
  if ((handle->PrevUserCallbackCursorEnter != (GLFWcursorenterfun)0x0) && (in_RDI == handle->Window)
     ) {
    (*handle->PrevUserCallbackCursorEnter)(in_RDI,in_ESI);
  }
  iVar1 = glfwGetInputMode((GLFWwindow *)handle,iVar1);
  if (iVar1 != 0x34003) {
    pIVar2 = ImGui::GetIO();
    if (in_ESI == 0) {
      if (handle->MouseWindow == in_RDI) {
        handle->LastValidMousePos = pIVar2->MousePos;
        handle->MouseWindow = (GLFWwindow *)0x0;
        ImGuiIO::AddMousePosEvent((ImGuiIO *)window,(float)entered,in_stack_00000018);
      }
    }
    else {
      handle->MouseWindow = in_RDI;
      ImGuiIO::AddMousePosEvent((ImGuiIO *)window,(float)entered,in_stack_00000018);
    }
  }
  return;
}

Assistant:

void ImGui_ImplGlfw_CursorEnterCallback(GLFWwindow* window, int entered)
{
    ImGui_ImplGlfw_Data* bd = ImGui_ImplGlfw_GetBackendData();
    if (bd->PrevUserCallbackCursorEnter != nullptr && window == bd->Window)
        bd->PrevUserCallbackCursorEnter(window, entered);
    if (glfwGetInputMode(window, GLFW_CURSOR) == GLFW_CURSOR_DISABLED)
        return;

    ImGuiIO& io = ImGui::GetIO();
    if (entered)
    {
        bd->MouseWindow = window;
        io.AddMousePosEvent(bd->LastValidMousePos.x, bd->LastValidMousePos.y);
    }
    else if (!entered && bd->MouseWindow == window)
    {
        bd->LastValidMousePos = io.MousePos;
        bd->MouseWindow = nullptr;
        io.AddMousePosEvent(-FLT_MAX, -FLT_MAX);
    }
}